

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

ParsedParameterVector * __thiscall
pbrt::
parseParameters<std::function<pstd::optional<pbrt::Token>(int)>,pbrt::parse(pbrt::SceneRepresentation*,std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>)::__5>
          (ParsedParameterVector *__return_storage_ptr__,pbrt *this,
          function<pstd::optional<pbrt::Token>_(int)> *nextToken,anon_class_8_1_6da50f9a ungetToken,
          Allocator alloc,bool formatting,
          function<void_(const_pbrt::Token_&,_const_char_*)> *errorCallback)

{
  string *s;
  undefined1 auVar1 [8];
  int iVar2;
  memory_resource *pmVar3;
  undefined8 extraout_RAX;
  ParsedParameterVector *pPVar5;
  ParsedParameterVector *extraout_RAX_00;
  char *pcVar6;
  anon_class_8_1_6da50f9a aVar7;
  size_t sVar9;
  char *pcVar10;
  char *pcVar11;
  long lVar12;
  undefined7 in_register_00000089;
  char *pcVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v;
  undefined1 auVar14 [16];
  string_view sVar15;
  ParsedParameter *param;
  string ret;
  ValType valType;
  optional<pbrt::Token> t;
  Token val;
  anon_class_24_3_4da73ed2 addVal;
  undefined1 local_120 [8];
  string local_118;
  int local_f8;
  int iStack_f4;
  char local_f0;
  undefined4 local_e0;
  undefined4 local_dc;
  ParsedParameterVector *local_d8;
  optional<pbrt::Token> *local_d0;
  ValType local_c4;
  optional<pbrt::Token> *local_c0;
  Token local_b8;
  char local_90;
  Token local_88;
  function<void_(const_pbrt::Token_&,_const_char_*)> *local_58;
  char *local_50;
  anon_class_24_3_4da73ed2 local_48;
  size_t sVar4;
  char *pcVar8;
  
  local_58 = (function<void_(const_pbrt::Token_&,_const_char_*)> *)
             CONCAT71(in_register_00000089,formatting);
  local_e0 = SUB84(alloc.memoryResource,0);
  aVar7.ungetToken = ungetToken.ungetToken;
  pmVar3 = pstd::pmr::new_delete_resource();
  (__return_storage_ptr__->alloc).memoryResource = pmVar3;
  __return_storage_ptr__->ptr = (ParsedParameter **)0x0;
  local_d0 = (optional<pbrt::Token> *)0x0;
  __return_storage_ptr__->nAlloc = 0;
  __return_storage_ptr__->nStored = 0;
  s = (string *)(local_120 + 8);
  local_d8 = __return_storage_ptr__;
  local_c0 = ungetToken.ungetToken;
  do {
    local_118._M_dataplus._M_p = local_118._M_dataplus._M_p & 0xffffffff00000000;
    if (*(long *)(this + 0x10) == 0) {
      std::__throw_bad_function_call();
    }
    (**(code **)(this + 0x18))(&local_b8,this,s);
    if (local_90 == '\0') {
LAB_003f410a:
      aVar7.ungetToken = (optional<pbrt::Token> *)CONCAT71((int7)((ulong)aVar7.ungetToken >> 8),1);
      pPVar5 = (ParsedParameterVector *)0x0;
      local_d0 = aVar7.ungetToken;
    }
    else {
      if (((local_b8.token._M_len < 2) ||
          (aVar7.ungetToken = (optional<pbrt::Token> *)local_b8.token._M_str,
          ((aligned_storage_t<sizeof(pbrt::Token),_alignof(pbrt::Token)> *)local_b8.token._M_str)->
          __data[0] != '\"')) ||
         (*(char *)((long)local_b8.token._M_str + (local_b8.token._M_len - 1)) != '\"')) {
        if (nextToken[1].super__Function_base._M_functor._M_pod_data[8] == '\x01') {
          LogFatal<char_const(&)[24]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp"
                     ,0x244,"Check failed: %s",(char (*) [24])"!ungetToken.has_value()");
        }
        *(undefined8 *)&nextToken[1].super__Function_base._M_functor = local_b8.loc._16_8_;
        *(size_t *)&(nextToken->super__Function_base)._M_functor = local_b8.token._M_len;
        *(char **)((long)&(nextToken->super__Function_base)._M_functor + 8) = local_b8.token._M_str;
        (nextToken->super__Function_base)._M_manager = (_Manager_type)local_b8.loc.filename._M_len;
        nextToken->_M_invoker = (_Invoker_type)local_b8.loc.filename._M_str;
        nextToken[1].super__Function_base._M_functor._M_pod_data[8] = '\x01';
        goto LAB_003f410a;
      }
      local_120 = (undefined1  [8])
                  (**(code **)((long)((ungetToken.ungetToken)->optionalValue).__align + 0x10))
                            (ungetToken.ungetToken,0xd0,8);
      local_118.field_2._M_allocated_capacity._0_4_ = local_b8.loc.line;
      local_118.field_2._M_allocated_capacity._4_4_ = local_b8.loc.column;
      local_118._M_dataplus._M_p = (pointer)local_b8.loc.filename._M_len;
      local_118._M_string_length = (size_type)local_b8.loc.filename._M_str;
      *(long **)local_120 = (long *)((long)local_120 + 0x10);
      *(long *)((long)local_120 + 8) = 0;
      *(undefined1 *)((long)local_120 + 0x10) = 0;
      *(long **)((long)local_120 + 0x20) = (long *)((long)local_120 + 0x30);
      *(long *)((long)local_120 + 0x28) = 0;
      *(undefined1 *)((long)local_120 + 0x30) = 0;
      *(size_t *)((long)local_120 + 0x40) = local_b8.loc.filename._M_len;
      *(char **)((long)local_120 + 0x48) = local_b8.loc.filename._M_str;
      auVar14 = ZEXT816(0) << 0x20;
      *(undefined8 *)((long)local_120 + 0x50) = local_b8.loc._16_8_;
      *(optional<pbrt::Token> **)((long)local_120 + 0x58) = ungetToken.ungetToken;
      *(undefined1 (*) [16])((long)local_120 + 0x60) = auVar14;
      *(long *)((long)local_120 + 0x70) = 0;
      *(optional<pbrt::Token> **)((long)local_120 + 0x78) = ungetToken.ungetToken;
      *(undefined1 (*) [16])((long)local_120 + 0x80) = auVar14;
      *(long *)((long)local_120 + 0x90) = 0;
      *(optional<pbrt::Token> **)((long)local_120 + 0x98) = ungetToken.ungetToken;
      *(long *)((long)local_120 + 0xc0) = 0;
      *(undefined1 *)((long)local_120 + 200) = 0;
      *(undefined1 (*) [16])((long)local_120 + 0xa9) = auVar14;
      *(undefined1 (*) [16])((long)local_120 + 0xa0) = auVar14;
      if (local_90 == '\0') {
        LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x30c2e65);
      }
      sVar15 = dequoteString(&local_b8);
      pcVar8 = sVar15._M_str;
      sVar4 = sVar15._M_len;
      pcVar13 = pcVar8 + sVar4;
      pcVar6 = pcVar8;
      if (sVar4 != 0) {
        while( true ) {
          pcVar6 = sVar15._M_str;
          if ((*pcVar6 != ' ') && (*pcVar6 != '\t')) break;
          sVar9 = sVar15._M_len - 1;
          sVar15._M_str = pcVar6 + 1;
          sVar15._M_len = sVar9;
          if (sVar9 == 0) goto LAB_003f44d9;
        }
      }
      if (pcVar6 == pcVar13) {
LAB_003f44d9:
        if (local_90 == '\0') {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x30c2e65);
        }
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)(local_120 + 8),pcVar8,pcVar13);
        ErrorExit<std::__cxx11::string>
                  (&local_b8.loc,"Parameter \"%s\" doesn\'t have a type declaration?!",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_120 + 8));
      }
      local_50 = pcVar8 + sVar4;
      pcVar10 = pcVar6;
      do {
        pcVar11 = pcVar10;
        if ((*pcVar10 == '\t') || (*pcVar10 == ' ')) break;
        pcVar10 = pcVar10 + 1;
        pcVar11 = local_50;
      } while (pcVar10 != pcVar13);
      std::__cxx11::string::replace
                ((ulong)local_120,0,*(char **)((long)local_120 + 8),(ulong)pcVar6);
      if ((char)local_e0 != '\0') {
        iVar2 = std::__cxx11::string::compare((char *)local_120);
        if (iVar2 == 0) {
          std::__cxx11::string::_M_replace
                    ((ulong)local_120,0,*(char **)((long)local_120 + 8),0x61d2a3);
        }
        iVar2 = std::__cxx11::string::compare((char *)local_120);
        if (iVar2 == 0) {
          std::__cxx11::string::_M_replace
                    ((ulong)local_120,0,*(char **)((long)local_120 + 8),0xad523f);
        }
      }
      if (pcVar13 == pcVar11) {
LAB_003f4590:
        if (local_90 == '\0') {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x30c2e65);
        }
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)(local_120 + 8),pcVar8,pcVar13);
        ErrorExit<std::__cxx11::string>
                  (&local_b8.loc,"Unable to find parameter name from \"%s\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_120 + 8));
      }
      do {
        if ((*pcVar11 != ' ') && (pcVar6 = pcVar11, *pcVar11 != '\t')) break;
        pcVar11 = pcVar11 + 1;
        pcVar6 = local_50;
      } while (pcVar11 != pcVar13);
      pcVar10 = pcVar6;
      if (pcVar6 == pcVar13) goto LAB_003f4590;
      do {
        if ((*pcVar10 == '\t') || (*pcVar10 == ' ')) break;
        pcVar10 = pcVar10 + 1;
      } while (pcVar10 != pcVar13);
      std::__cxx11::string::replace
                ((ulong)((long)local_120 + 0x20),0,*(char **)((long)local_120 + 0x28),(ulong)pcVar6)
      ;
      ungetToken.ungetToken = local_c0;
      local_48.valType = &local_c4;
      aVar7.ungetToken = (optional<pbrt::Token> *)local_120;
      local_c4 = Unknown;
      local_dc = 1;
      local_48.errorCallback = local_58;
      local_48.param = (ParsedParameter **)aVar7.ungetToken;
      if (*(long *)(this + 0x10) == 0) {
        std::__throw_bad_function_call();
      }
      (**(code **)(this + 0x18))(s,this,&local_dc);
      if (local_f0 == '\0') {
        LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x30c2e65);
      }
      local_88.loc.line = local_f8;
      local_88.loc.column = iStack_f4;
      local_88.token._M_len = (size_t)local_118._M_dataplus._M_p;
      local_88.token._M_str = (char *)local_118._M_string_length;
      local_88.loc.filename._M_len = local_118.field_2._M_allocated_capacity;
      local_88.loc.filename._M_str = (char *)local_118.field_2._8_8_;
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_118._M_dataplus._M_p ==
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x1) && (*(char *)local_118._M_string_length == '[')) {
        while( true ) {
          local_dc = 1;
          if (*(long *)(this + 0x10) == 0) {
            std::__throw_bad_function_call();
          }
          (**(code **)(this + 0x18))(s,this,&local_dc);
          if (local_f0 == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x30c2e65);
          }
          local_88.loc.line = local_f8;
          local_88.loc.column = iStack_f4;
          local_88.token._M_len = (size_t)local_118._M_dataplus._M_p;
          local_88.token._M_str = (char *)local_118._M_string_length;
          local_88.loc.filename._M_len = local_118.field_2._M_allocated_capacity;
          local_88.loc.filename._M_str = (char *)local_118.field_2._8_8_;
          if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_118._M_dataplus._M_p ==
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x1) && (*(char *)local_118._M_string_length == ']')) break;
          parseParameters<std::function<pstd::optional<pbrt::Token>_(int)>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:579:18)>
          ::anon_class_24_3_4da73ed2::operator()(&local_48,&local_88);
        }
      }
      else {
        parseParameters<std::function<pstd::optional<pbrt::Token>_(int)>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:579:18)>
        ::anon_class_24_3_4da73ed2::operator()(&local_48,&local_88);
      }
      if (((char)local_e0 != '\0') &&
         (iVar2 = std::__cxx11::string::compare((char *)local_120), iVar2 == 0)) {
        if (*(long *)((long)local_120 + 0x90) != 0) {
          v = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
               ((long)local_120 + 0x80);
          lVar12 = *(long *)((long)local_120 + 0x90) << 5;
          do {
            iVar2 = std::__cxx11::string::compare((char *)v);
            if (iVar2 == 0) {
              local_118._M_dataplus._M_p._0_1_ = 1;
              pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::
              push_back((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                        ((long)local_120 + 0x98),(uchar *)s);
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)v);
              auVar1 = local_120;
              if (iVar2 == 0) {
                local_118._M_dataplus._M_p = local_118._M_dataplus._M_p & 0xffffffffffffff00;
                pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::
                push_back((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *
                          )((long)local_120 + 0x98),(uchar *)s);
              }
              else {
                local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                local_118._M_string_length = 0;
                local_118.field_2._M_allocated_capacity =
                     local_118.field_2._M_allocated_capacity & 0xffffffffffffff00;
                detail::stringPrintfRecursive<std::__cxx11::string_const&>
                          (s,"%s: neither \"true\" nor \"false\" in bool parameter list.",v);
                Error((FileLoc *)((long)auVar1 + 0x40),local_118._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118._M_dataplus._M_p != &local_118.field_2) {
                  operator_delete(local_118._M_dataplus._M_p,
                                  local_118.field_2._M_allocated_capacity + 1);
                }
              }
            }
            v = v + 1;
            lVar12 = lVar12 + -0x20;
          } while (lVar12 != 0);
        }
        pstd::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)local_120 + 0x78));
        ungetToken.ungetToken = local_c0;
      }
      InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
      ::push_back(local_d8,(ParsedParameter **)local_120);
      pPVar5 = (ParsedParameterVector *)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    }
    if ((char)pPVar5 == '\0') {
      if (((ulong)local_d0 & 1) == 0) {
        InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
        ::~InlinedVector(local_d8);
        pPVar5 = extraout_RAX_00;
      }
      return pPVar5;
    }
  } while( true );
}

Assistant:

static ParsedParameterVector parseParameters(
    Next nextToken, Unget ungetToken, Allocator alloc, bool formatting,
    const std::function<void(const Token &token, const char *)> &errorCallback) {
    ParsedParameterVector parameterVector;

    while (true) {
        pstd::optional<Token> t = nextToken(TokenOptional);
        if (!t.has_value())
            return parameterVector;

        if (!isQuotedString(t->token)) {
            ungetToken(*t);
            return parameterVector;
        }

        ParsedParameter *param = alloc.new_object<ParsedParameter>(alloc, t->loc);

        std::string_view decl = dequoteString(*t);

        auto skipSpace = [&decl](std::string_view::const_iterator iter) {
            while (iter != decl.end() && (*iter == ' ' || *iter == '\t'))
                ++iter;
            return iter;
        };
        // Skip to the next whitespace character (or the end of the string).
        auto skipToSpace = [&decl](std::string_view::const_iterator iter) {
            while (iter != decl.end() && *iter != ' ' && *iter != '\t')
                ++iter;
            return iter;
        };

        auto typeBegin = skipSpace(decl.begin());
        if (typeBegin == decl.end())
            ErrorExit(&t->loc, "Parameter \"%s\" doesn't have a type declaration?!",
                      std::string(decl.begin(), decl.end()));

        // Find end of type declaration
        auto typeEnd = skipToSpace(typeBegin);
        param->type.assign(typeBegin, typeEnd);

        if (formatting) {  // close enough: upgrade...
            if (param->type == "point")
                param->type = "point3";
            if (param->type == "color")
                param->type = "rgb";
        }

        auto nameBegin = skipSpace(typeEnd);
        if (nameBegin == decl.end())
            ErrorExit(&t->loc, "Unable to find parameter name from \"%s\"",
                      std::string(decl.begin(), decl.end()));

        auto nameEnd = skipToSpace(nameBegin);
        param->name.assign(nameBegin, nameEnd);

        enum ValType { Unknown, String, Bool, Number } valType = Unknown;

        auto addVal = [&](const Token &t) {
            if (isQuotedString(t.token)) {
                switch (valType) {
                case Unknown:
                    valType = String;
                    break;
                case String:
                    break;
                case Number:
                    errorCallback(t, "expected number");
                case Bool:
                    errorCallback(t, "expected bool");
                }

                param->AddString(dequoteString(t));
            } else if (t.token[0] == 't' && t.token == "true") {
                switch (valType) {
                case Unknown:
                    valType = Bool;
                    break;
                case String:
                    errorCallback(t, "expected string");
                case Number:
                    errorCallback(t, "expected number");
                case Bool:
                    break;
                }

                param->AddBool(true);
            } else if (t.token[0] == 'f' && t.token == "false") {
                switch (valType) {
                case Unknown:
                    valType = Bool;
                    break;
                case String:
                    errorCallback(t, "expected string");
                case Number:
                    errorCallback(t, "expected number");
                case Bool:
                    break;
                }

                param->AddBool(false);
            } else {
                switch (valType) {
                case Unknown:
                    valType = Number;
                    break;
                case String:
                    errorCallback(t, "expected string");
                case Number:
                    break;
                case Bool:
                    errorCallback(t, "expected bool");
                }

                param->AddNumber(parseNumber(t));
            }
        };

        Token val = *nextToken(TokenRequired);

        if (val.token == "[") {
            while (true) {
                val = *nextToken(TokenRequired);
                if (val.token == "]")
                    break;
                addVal(val);
            }
        } else {
            addVal(val);
        }

        if (formatting && param->type == "bool") {
            for (const auto &b : param->strings) {
                if (b == "true")
                    param->bools.push_back(true);
                else if (b == "false")
                    param->bools.push_back(false);
                else
                    Error(&param->loc,
                          "%s: neither \"true\" nor \"false\" in bool "
                          "parameter list.",
                          b);
            }
            param->strings.clear();
        }

        parameterVector.push_back(param);
    }

    return parameterVector;
}